

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

host_ca * host_ca_load(char *name)

{
  int iVar1;
  char *pcVar2;
  FILE *fp_00;
  char *pcVar3;
  size_t sVar4;
  strbuf *psVar5;
  char *__s;
  ptrlen pVar6;
  char *value;
  CertExprBuilder *eb;
  char *line;
  host_ca *hca;
  FILE *fp;
  char *filename;
  char *name_local;
  
  pcVar2 = make_filename(7,name);
  fp_00 = fopen(pcVar2,"r");
  safefree(pcVar2);
  if (fp_00 == (FILE *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    name_local = (char *)host_ca_new();
    pcVar2 = dupstr(name);
    ((host_ca *)name_local)->name = pcVar2;
    value = (char *)0x0;
    while (pcVar2 = fgetline((FILE *)fp_00), pcVar2 != (char *)0x0) {
      pcVar3 = strchr(pcVar2,0x3d);
      if (pcVar3 == (char *)0x0) {
        safefree(pcVar2);
      }
      else {
        __s = pcVar3 + 1;
        *pcVar3 = '\0';
        sVar4 = strcspn(__s,"\r\n");
        __s[sVar4] = '\0';
        iVar1 = strcmp(pcVar2,"PublicKey");
        if (iVar1 == 0) {
          pVar6 = ptrlen_from_asciz(__s);
          psVar5 = base64_decode_sb(pVar6);
          ((host_ca *)name_local)->ca_public_key = psVar5;
        }
        else {
          iVar1 = strcmp(pcVar2,"MatchHosts");
          if (iVar1 == 0) {
            if (value == (char *)0x0) {
              value = (char *)cert_expr_builder_new();
            }
            cert_expr_builder_add((CertExprBuilder *)value,__s);
          }
          else {
            iVar1 = strcmp(pcVar2,"Validity");
            if (iVar1 == 0) {
              pVar6 = ptrlen_from_asciz(__s);
              psVar5 = percent_decode_sb(pVar6);
              pcVar3 = strbuf_to_str(psVar5);
              ((host_ca *)name_local)->validity_expression = pcVar3;
            }
            else {
              iVar1 = strcmp(pcVar2,"PermitRSASHA1");
              if (iVar1 == 0) {
                iVar1 = atoi(__s);
                (((host_ca *)name_local)->opts).permit_rsa_sha1 = iVar1 != 0;
              }
              else {
                iVar1 = strcmp(pcVar2,"PermitRSASHA256");
                if (iVar1 == 0) {
                  iVar1 = atoi(__s);
                  (((host_ca *)name_local)->opts).permit_rsa_sha256 = iVar1 != 0;
                }
                else {
                  iVar1 = strcmp(pcVar2,"PermitRSASHA512");
                  if (iVar1 == 0) {
                    iVar1 = atoi(__s);
                    (((host_ca *)name_local)->opts).permit_rsa_sha512 = iVar1 != 0;
                  }
                }
              }
            }
          }
        }
        safefree(pcVar2);
      }
    }
    if (value != (char *)0x0) {
      if (((host_ca *)name_local)->validity_expression == (char *)0x0) {
        pcVar2 = cert_expr_expression((CertExprBuilder *)value);
        ((host_ca *)name_local)->validity_expression = pcVar2;
      }
      cert_expr_builder_free((CertExprBuilder *)value);
    }
  }
  return (host_ca *)name_local;
}

Assistant:

host_ca *host_ca_load(const char *name)
{
    char *filename = make_filename(INDEX_HOSTCA, name);
    FILE *fp = fopen(filename, "r");
    sfree(filename);
    if (!fp)
        return NULL;

    host_ca *hca = host_ca_new();
    hca->name = dupstr(name);

    char *line;
    CertExprBuilder *eb = NULL;

    while ( (line = fgetline(fp)) ) {
        char *value = strchr(line, '=');

        if (!value) {
            sfree(line);
            continue;
        }
        *value++ = '\0';
        value[strcspn(value, "\r\n")] = '\0';   /* trim trailing NL */

        if (!strcmp(line, "PublicKey")) {
            hca->ca_public_key = base64_decode_sb(ptrlen_from_asciz(value));
        } else if (!strcmp(line, "MatchHosts")) {
            if (!eb)
                eb = cert_expr_builder_new();
            cert_expr_builder_add(eb, value);
        } else if (!strcmp(line, "Validity")) {
            hca->validity_expression = strbuf_to_str(
                percent_decode_sb(ptrlen_from_asciz(value)));
        } else if (!strcmp(line, "PermitRSASHA1")) {
            hca->opts.permit_rsa_sha1 = atoi(value);
        } else if (!strcmp(line, "PermitRSASHA256")) {
            hca->opts.permit_rsa_sha256 = atoi(value);
        } else if (!strcmp(line, "PermitRSASHA512")) {
            hca->opts.permit_rsa_sha512 = atoi(value);
        }

        sfree(line);
    }

    if (eb) {
        if (!hca->validity_expression) {
            hca->validity_expression = cert_expr_expression(eb);
        }
        cert_expr_builder_free(eb);
    }

    return hca;
}